

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O0

int test_mp_check(void)

{
  int iVar1;
  char *local_240;
  char *p_70;
  char *p_69;
  char *p_68;
  char *p_67;
  char *p_66;
  char *p_65;
  char *p_64;
  char *p_63;
  char *p_62;
  char *p_61;
  char *p_60;
  char *p_59;
  char *p_58;
  char *p_57;
  char *p_56;
  char *p_55;
  char *p_54;
  char *p_53;
  char *p_52;
  char *p_51;
  char *p_50;
  char *p_49;
  char *p_48;
  char *p_47;
  char *p_46;
  char *p_45;
  char *p_44;
  char *p_43;
  char *p_42;
  char *p_41;
  char *p_40;
  char *p_39;
  char *p_38;
  char *p_37;
  char *p_36;
  char *p_35;
  char *p_34;
  char *p_33;
  char *p_32;
  char *p_31;
  char *p_30;
  char *p_29;
  char *p_28;
  char *p_27;
  char *p_26;
  char *p_25;
  char *p_24;
  char *p_23;
  char *p_22;
  char *p_21;
  char *p_20;
  char *p_19;
  char *p_18;
  char *p_17;
  char *p_16;
  char *p_15;
  char *p_14;
  char *p_13;
  char *p_12;
  char *p_11;
  char *p_10;
  char *p_9;
  char *p_8;
  char *p_7;
  char *p_6;
  char *p_5;
  char *p_4;
  char *p_3;
  char *p_2;
  char *p_1;
  char *p;
  
  _plan(0x47,true);
  _space(_stdout);
  printf("# *** %s ***\n","test_mp_check");
  p_1 = anon_var_dwarf_2167 + 1;
  iVar1 = mp_check(&p_1,anon_var_dwarf_2167 + 2);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\x81\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x559,
      "invalid fixmap 1");
  p_2 = anon_var_dwarf_377;
  iVar1 = mp_check(&p_2,anon_var_dwarf_377 + 2);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\x81\\x01\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x55a,
      "invalid fixmap 2");
  p_3 = anon_var_dwarf_3b0;
  iVar1 = mp_check(&p_3,anon_var_dwarf_3b0 + 2);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\x8f\\x01\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x55b,
      "invalid fixmap 3");
  p_4 = anon_var_dwarf_3d1;
  iVar1 = mp_check(&p_4,anon_var_dwarf_3d1 + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\x91\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x55e,
      "invalid fixarray 1");
  p_5 = anon_var_dwarf_3fe;
  iVar1 = mp_check(&p_5,anon_var_dwarf_3fe + 2);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\x92\\x01\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x55f,
      "invalid fixarray 2");
  p_6 = anon_var_dwarf_41f;
  iVar1 = mp_check(&p_6,anon_var_dwarf_41f + 2);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\x9f\\x01\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x560,
      "invalid fixarray 3");
  p_7 = anon_var_dwarf_440;
  iVar1 = mp_check(&p_7,anon_var_dwarf_440 + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xa1\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x563,
      "invalid fixstr 1");
  p_8 = anon_var_dwarf_461;
  iVar1 = mp_check(&p_8,anon_var_dwarf_461 + 2);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xa2\\x00\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x564,
      "invalid fixstr 2");
  p_9 = anon_var_dwarf_482;
  iVar1 = mp_check(&p_9,anon_var_dwarf_482 + 2);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xbf\\x00\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x565,
      "invalid fixstr 3");
  p_10 = anon_var_dwarf_4a3;
  iVar1 = mp_check(&p_10,anon_var_dwarf_4a3 + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc4\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x568,
      "invalid bin8 1");
  p_11 = anon_var_dwarf_4c4;
  iVar1 = mp_check(&p_11,anon_var_dwarf_4c4 + 2);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc4\\x01\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x569,
      "invalid bin8 2");
  p_12 = anon_var_dwarf_4e5;
  iVar1 = mp_check(&p_12,anon_var_dwarf_4e5 + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc5\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x56c,
      "invalid bin16 1");
  p_13 = anon_var_dwarf_512;
  iVar1 = mp_check(&p_13,anon_var_dwarf_512 + 3);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc5\\x00\\x01\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x56d,
      "invalid bin16 2");
  p_14 = anon_var_dwarf_53f;
  iVar1 = mp_check(&p_14,anon_var_dwarf_53f + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc6\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x570,
      "invalid bin32 1");
  p_15 = anon_var_dwarf_560;
  iVar1 = mp_check(&p_15,anon_var_dwarf_560 + 5);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc6\\x00\\x00\\x00\\x01\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x571,
      "invalid bin32 2");
  p_16 = anon_var_dwarf_58d;
  iVar1 = mp_check(&p_16,anon_var_dwarf_58d + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc7\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x574,
      "invalid ext8 1");
  p_17 = anon_var_dwarf_5ae;
  iVar1 = mp_check(&p_17,anon_var_dwarf_5ae + 2);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc7\\x00\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x575,
      "invalid ext8 2");
  p_18 = anon_var_dwarf_5cf;
  iVar1 = mp_check(&p_18,anon_var_dwarf_5cf + 3);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc7\\x01\\xff\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x576,
      "invalid ext8 3");
  p_19 = anon_var_dwarf_5f0;
  iVar1 = mp_check(&p_19,anon_var_dwarf_5f0 + 4);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc7\\x02\\xff\\x00\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x577,
      "invalid ext8 4");
  p_20 = anon_var_dwarf_61d;
  iVar1 = mp_check(&p_20,anon_var_dwarf_61d + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc8\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x57a,
      "invalid ext16 1");
  p_21 = anon_var_dwarf_63e;
  iVar1 = mp_check(&p_21,anon_var_dwarf_63e + 3);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc8\\x00\\x00\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x57b,
      "invalid ext16 2");
  p_22 = anon_var_dwarf_65f;
  iVar1 = mp_check(&p_22,anon_var_dwarf_65f + 4);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc8\\x00\\x01\\xff\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x57c,
      "invalid ext16 3");
  p_23 = anon_var_dwarf_680;
  iVar1 = mp_check(&p_23,anon_var_dwarf_680 + 5);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc8\\x00\\x02\\xff\\x00\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x57d,
      "invalid ext16 4");
  p_24 = anon_var_dwarf_6a1;
  iVar1 = mp_check(&p_24,anon_var_dwarf_6a1 + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc9\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x580,
      "invalid ext32 1");
  p_25 = anon_var_dwarf_6c2;
  iVar1 = mp_check(&p_25,anon_var_dwarf_6c2 + 5);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc9\\x00\\x00\\x00\\x00\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x581,
      "invalid ext32 2");
  p_26 = anon_var_dwarf_6e3;
  iVar1 = mp_check(&p_26,anon_var_dwarf_6e3 + 6);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc9\\x00\\x00\\x00\\x01\\xff\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x582,
      "invalid ext32 3");
  p_27 = anon_var_dwarf_710;
  iVar1 = mp_check(&p_27,anon_var_dwarf_710 + 7);
  _ok((uint)(iVar1 != 0),
      "mp_check(&p, p + sizeof(\"\\xc9\\x00\\x00\\x00\\x02\\xff\\x00\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x583,
      "invalid ext32 4");
  p_28 = anon_var_dwarf_749;
  iVar1 = mp_check(&p_28,anon_var_dwarf_749 + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xca\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x586,
      "invalid float32 1");
  p_29 = anon_var_dwarf_76a;
  iVar1 = mp_check(&p_29,anon_var_dwarf_76a + 4);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xca\\x00\\x00\\x00\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x587,
      "invalid float32 2");
  p_30 = anon_var_dwarf_78c;
  iVar1 = mp_check(&p_30,anon_var_dwarf_78c + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xcb\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x58a,
      "invalid float64 1");
  p_31 = anon_var_dwarf_7b0;
  iVar1 = mp_check(&p_31,anon_var_dwarf_7b0 + 8);
  _ok((uint)(iVar1 != 0),
      "mp_check(&p, p + sizeof(\"\\xcb\\x00\\x00\\x00\\x00\\x00\\x00\\x00\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x58b,
      "invalid float64 2");
  p_32 = anon_var_dwarf_7e0;
  iVar1 = mp_check(&p_32,anon_var_dwarf_7e0 + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xcc\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x58e,
      "invalid uint8 1");
  p_33 = anon_var_dwarf_804;
  iVar1 = mp_check(&p_33,anon_var_dwarf_804 + 2);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xcd\\x00\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x591,
      "invalid uint16 1");
  p_34 = anon_var_dwarf_828;
  iVar1 = mp_check(&p_34,anon_var_dwarf_828 + 4);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xce\\x00\\x00\\x00\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x594,
      "invalid uint32 1");
  p_35 = anon_var_dwarf_84c;
  iVar1 = mp_check(&p_35,anon_var_dwarf_84c + 8);
  _ok((uint)(iVar1 != 0),
      "mp_check(&p, p + sizeof(\"\\xcf\\x00\\x00\\x00\\x00\\x00\\x00\\x00\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x597,
      "invalid uint64 1");
  p_36 = anon_var_dwarf_870;
  iVar1 = mp_check(&p_36,anon_var_dwarf_870 + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xd0\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x59a,
      "invalid int8 1");
  p_37 = anon_var_dwarf_894;
  iVar1 = mp_check(&p_37,anon_var_dwarf_894 + 2);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xd1\\x00\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x59d,
      "invalid int16 1");
  p_38 = anon_var_dwarf_8b8;
  iVar1 = mp_check(&p_38,anon_var_dwarf_8b8 + 4);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xd2\\x00\\x00\\x00\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5a0,
      "invalid int32 1");
  p_39 = anon_var_dwarf_8dc;
  iVar1 = mp_check(&p_39,anon_var_dwarf_8dc + 8);
  _ok((uint)(iVar1 != 0),
      "mp_check(&p, p + sizeof(\"\\xd3\\x00\\x00\\x00\\x00\\x00\\x00\\x00\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5a3,
      "invalid int64 1");
  p_40 = anon_var_dwarf_900;
  iVar1 = mp_check(&p_40,anon_var_dwarf_900 + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xd4\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5a6,
      "invalid fixext8 1");
  p_41 = anon_var_dwarf_924;
  iVar1 = mp_check(&p_41,anon_var_dwarf_924 + 2);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xd4\\x05\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5a7,
      "invalid fixext8 2");
  p_42 = anon_var_dwarf_948;
  iVar1 = mp_check(&p_42,anon_var_dwarf_948 + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xd5\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5aa,
      "invalid fixext16 1");
  p_43 = anon_var_dwarf_96c;
  iVar1 = mp_check(&p_43,anon_var_dwarf_96c + 3);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xd5\\x05\\x05\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5ab,
      "invalid fixext16 2");
  p_44 = anon_var_dwarf_990;
  iVar1 = mp_check(&p_44,anon_var_dwarf_990 + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xd6\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5ae,
      "invalid fixext32 1");
  p_45 = anon_var_dwarf_9b4;
  iVar1 = mp_check(&p_45,anon_var_dwarf_9b4 + 5);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xd6\\x00\\x00\\x05\\x05\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5af,
      "invalid fixext32 2");
  p_46 = anon_var_dwarf_9d8;
  iVar1 = mp_check(&p_46,anon_var_dwarf_9d8 + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xd7\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5b2,
      "invalid fixext64 1");
  p_47 = anon_var_dwarf_9fc;
  iVar1 = mp_check(&p_47,anon_var_dwarf_9fc + 9);
  _ok((uint)(iVar1 != 0),
      "mp_check(&p, p + sizeof(\"\\xd7\\x00\\x00\\x00\\x00\\x00\\x00\\x05\\x05\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5b3,
      "invalid fixext64 2");
  p_48 = anon_var_dwarf_a2c;
  iVar1 = mp_check(&p_48,anon_var_dwarf_a2c + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xd8\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5b6,
      "invalid fixext128 1");
  p_49 = anon_var_dwarf_a50;
  iVar1 = mp_check(&p_49,anon_var_dwarf_a50 + 0x11);
  _ok((uint)(iVar1 != 0),
      "mp_check(&p, p + sizeof(\"\\xd8\\x00\\x00\\x00\\x00\\x00\\x00\\x00\\x00\\x00\\x00\\x00\\x00\\x00\" \"\\x00\\x05\\x05\") - 1) != 0"
      ,"/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5b8
      ,"invalid fixext128 2");
  p_50 = anon_var_dwarf_a80;
  iVar1 = mp_check(&p_50,anon_var_dwarf_a80 + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xd9\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5bb,
      "invalid str8 1");
  p_51 = anon_var_dwarf_aa4;
  iVar1 = mp_check(&p_51,anon_var_dwarf_aa4 + 2);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xd9\\x01\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5bc,
      "invalid str8 2");
  p_52 = anon_var_dwarf_ac8;
  iVar1 = mp_check(&p_52,anon_var_dwarf_ac8 + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xda\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5bf,
      "invalid str16 1");
  p_53 = anon_var_dwarf_aec;
  iVar1 = mp_check(&p_53,anon_var_dwarf_aec + 3);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xda\\x00\\x01\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5c0,
      "invalid str16 2");
  p_54 = anon_var_dwarf_b10;
  iVar1 = mp_check(&p_54,anon_var_dwarf_b10 + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xdb\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5c3,
      "invalid str32 1");
  p_55 = anon_var_dwarf_b34;
  iVar1 = mp_check(&p_55,anon_var_dwarf_b34 + 5);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xdb\\x00\\x00\\x00\\x01\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5c4,
      "invalid str32 2");
  p_56 = anon_var_dwarf_2c8f + 4;
  iVar1 = mp_check(&p_56,anon_var_dwarf_2c8f + 5);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xdc\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5c7,
      "invalid array16 1");
  p_57 = anon_var_dwarf_b7c;
  iVar1 = mp_check(&p_57,anon_var_dwarf_b7c + 3);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xdc\\x00\\x01\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5c8,
      "invalid array16 2");
  p_58 = anon_var_dwarf_ba0;
  iVar1 = mp_check(&p_58,anon_var_dwarf_ba0 + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xdd\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5cb,
      "invalid array32 1");
  p_59 = anon_var_dwarf_bc4;
  iVar1 = mp_check(&p_59,anon_var_dwarf_bc4 + 5);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xdd\\x00\\x00\\x00\\x01\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5cc,
      "invalid array32 2");
  p_60 = anon_var_dwarf_be8;
  iVar1 = mp_check(&p_60,anon_var_dwarf_be8 + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xde\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5cf,
      "invalid map16 1");
  p_61 = anon_var_dwarf_c0c;
  iVar1 = mp_check(&p_61,anon_var_dwarf_c0c + 3);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xde\\x00\\x01\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5d0,
      "invalid map16 2");
  p_62 = anon_var_dwarf_c30;
  iVar1 = mp_check(&p_62,anon_var_dwarf_c30 + 4);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xde\\x00\\x01\\x5\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5d1,
      "invalid map16 3");
  p_63 = anon_var_dwarf_c60;
  iVar1 = mp_check(&p_63,anon_var_dwarf_c60 + 3);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xde\\x80\\x00\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5d2,
      "invalid map16 4");
  p_64 = anon_var_dwarf_20bf + 1;
  iVar1 = mp_check(&p_64,anon_var_dwarf_20bf + 2);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xdf\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5d5,
      "invalid map32 1");
  p_65 = anon_var_dwarf_ca8;
  iVar1 = mp_check(&p_65,anon_var_dwarf_ca8 + 5);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xdf\\x00\\x00\\x00\\x01\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5d6,
      "invalid map32 2");
  p_66 = anon_var_dwarf_ccc;
  iVar1 = mp_check(&p_66,anon_var_dwarf_ccc + 6);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xdf\\x00\\x00\\x00\\x01\\x5\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5d7,
      "invalid map32 3");
  p_67 = anon_var_dwarf_cfc;
  iVar1 = mp_check(&p_67,anon_var_dwarf_cfc + 5);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xdf\\x80\\x00\\x00\\x00\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5d8,
      "invalid map32 4");
  p_68 = anon_var_dwarf_8ad7 + 2;
  iVar1 = mp_check(&p_68,anon_var_dwarf_8ad7 + 3);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc1\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5db,
      "invalid header 1");
  p_69 = anon_var_dwarf_8ad7 + 1;
  iVar1 = mp_check(&p_69,anon_var_dwarf_8ad7 + 3);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\x91\\xc1\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5dc,
      "invalid header 2");
  p_70 = anon_var_dwarf_d68;
  iVar1 = mp_check(&p_70,anon_var_dwarf_d68 + 4);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\x93\\xff\\xc1\\xff\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5dd,
      "invalid header 3");
  local_240 = anon_var_dwarf_d8c;
  iVar1 = mp_check(&local_240,anon_var_dwarf_d8c + 5);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\x82\\xff\\xc1\\xff\\xff\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5de,
      "invalid header 4");
  _space(_stdout);
  printf("# *** %s: done ***\n","test_mp_check");
  iVar1 = check_plan();
  return iVar1;
}

Assistant:

int
test_mp_check()
{
	plan(71);
	header();

#define invalid(data, fmt, ...) ({ \
	const char *p = data; \
	isnt(mp_check(&p, p + sizeof(data) - 1), 0, fmt, ## __VA_ARGS__); \
})

	/* fixmap */
	invalid("\x81", "invalid fixmap 1");
	invalid("\x81\x01", "invalid fixmap 2");
	invalid("\x8f\x01", "invalid fixmap 3");

	/* fixarray */
	invalid("\x91", "invalid fixarray 1");
	invalid("\x92\x01", "invalid fixarray 2");
	invalid("\x9f\x01", "invalid fixarray 3");

	/* fixstr */
	invalid("\xa1", "invalid fixstr 1");
	invalid("\xa2\x00", "invalid fixstr 2");
	invalid("\xbf\x00", "invalid fixstr 3");

	/* bin8 */
	invalid("\xc4", "invalid bin8 1");
	invalid("\xc4\x01", "invalid bin8 2");

	/* bin16 */
	invalid("\xc5", "invalid bin16 1");
	invalid("\xc5\x00\x01", "invalid bin16 2");

	/* bin32 */
	invalid("\xc6", "invalid bin32 1");
	invalid("\xc6\x00\x00\x00\x01", "invalid bin32 2");

	/* ext8 */
	invalid("\xc7", "invalid ext8 1");
	invalid("\xc7\x00", "invalid ext8 2");
	invalid("\xc7\x01\xff", "invalid ext8 3");
	invalid("\xc7\x02\xff\x00", "invalid ext8 4");

	/* ext16 */
	invalid("\xc8", "invalid ext16 1");
	invalid("\xc8\x00\x00", "invalid ext16 2");
	invalid("\xc8\x00\x01\xff", "invalid ext16 3");
	invalid("\xc8\x00\x02\xff\x00", "invalid ext16 4");

	/* ext32 */
	invalid("\xc9", "invalid ext32 1");
	invalid("\xc9\x00\x00\x00\x00", "invalid ext32 2");
	invalid("\xc9\x00\x00\x00\x01\xff", "invalid ext32 3");
	invalid("\xc9\x00\x00\x00\x02\xff\x00", "invalid ext32 4");

	/* float32 */
	invalid("\xca", "invalid float32 1");
	invalid("\xca\x00\x00\x00", "invalid float32 2");

	/* float64 */
	invalid("\xcb", "invalid float64 1");
	invalid("\xcb\x00\x00\x00\x00\x00\x00\x00", "invalid float64 2");

	/* uint8 */
	invalid("\xcc", "invalid uint8 1");

	/* uint16 */
	invalid("\xcd\x00", "invalid uint16 1");

	/* uint32 */
	invalid("\xce\x00\x00\x00", "invalid uint32 1");

	/* uint64 */
	invalid("\xcf\x00\x00\x00\x00\x00\x00\x00", "invalid uint64 1");

	/* int8 */
	invalid("\xd0", "invalid int8 1");

	/* int16 */
	invalid("\xd1\x00", "invalid int16 1");

	/* int32 */
	invalid("\xd2\x00\x00\x00", "invalid int32 1");

	/* int64 */
	invalid("\xd3\x00\x00\x00\x00\x00\x00\x00", "invalid int64 1");

	/* fixext8 */
	invalid("\xd4", "invalid fixext8 1");
	invalid("\xd4\x05", "invalid fixext8 2");

	/* fixext16 */
	invalid("\xd5", "invalid fixext16 1");
	invalid("\xd5\x05\x05", "invalid fixext16 2");

	/* fixext32 */
	invalid("\xd6", "invalid fixext32 1");
	invalid("\xd6\x00\x00\x05\x05", "invalid fixext32 2");

	/* fixext64 */
	invalid("\xd7", "invalid fixext64 1");
	invalid("\xd7\x00\x00\x00\x00\x00\x00\x05\x05", "invalid fixext64 2");

	/* fixext128 */
	invalid("\xd8", "invalid fixext128 1");
	invalid("\xd8\x00\x00\x00\x00\x00\x00\x00\x00\x00\x00\x00\x00\x00"
		"\x00\x05\x05", "invalid fixext128 2");

	/* str8 */
	invalid("\xd9", "invalid str8 1");
	invalid("\xd9\x01", "invalid str8 2");

	/* str16 */
	invalid("\xda", "invalid str16 1");
	invalid("\xda\x00\x01", "invalid str16 2");

	/* str32 */
	invalid("\xdb", "invalid str32 1");
	invalid("\xdb\x00\x00\x00\x01", "invalid str32 2");

	/* array16 */
	invalid("\xdc", "invalid array16 1");
	invalid("\xdc\x00\x01", "invalid array16 2");

	/* array32 */
	invalid("\xdd", "invalid array32 1");
	invalid("\xdd\x00\x00\x00\x01", "invalid array32 2");

	/* map16 */
	invalid("\xde", "invalid map16 1");
	invalid("\xde\x00\x01", "invalid map16 2");
	invalid("\xde\x00\x01\x5", "invalid map16 3");
	invalid("\xde\x80\x00", "invalid map16 4");

	/* map32 */
	invalid("\xdf", "invalid map32 1");
	invalid("\xdf\x00\x00\x00\x01", "invalid map32 2");
	invalid("\xdf\x00\x00\x00\x01\x5", "invalid map32 3");
	invalid("\xdf\x80\x00\x00\x00", "invalid map32 4");

	/* 0xc1 is never used */
	invalid("\xc1", "invalid header 1");
	invalid("\x91\xc1", "invalid header 2");
	invalid("\x93\xff\xc1\xff", "invalid header 3");
	invalid("\x82\xff\xc1\xff\xff", "invalid header 4");

#undef invalid

	footer();

	return check_plan();
}